

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedPointerVector.hpp
# Opt level: O2

optional<unsigned_long> __thiscall
gmlc::containers::MappedPointerVector<helics::FederateState,std::__cxx11::string>::
insert<std::__cxx11::string,helics::CoreFederateInfo_const&>
          (MappedPointerVector<helics::FederateState,std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchValue,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data,
          CoreFederateInfo *data_1)

{
  undefined8 uVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar2;
  optional<unsigned_long> oVar3;
  size_type index;
  unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_> local_40;
  _Storage<unsigned_long,_true> local_38;
  
  local_38 = (_Storage<unsigned_long,_true>)
             std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(this + 0x18),searchValue);
  if ((__node_type *)local_38._M_value == (__node_type *)0x0) {
    local_38._M_value = *(long *)(this + 8) - *(long *)this >> 3;
    std::make_unique<helics::FederateState,std::__cxx11::string,helics::CoreFederateInfo_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40,
               (CoreFederateInfo *)data);
    std::
    vector<std::unique_ptr<helics::FederateState,std::default_delete<helics::FederateState>>,std::allocator<std::unique_ptr<helics::FederateState,std::default_delete<helics::FederateState>>>>
    ::
    emplace_back<std::unique_ptr<helics::FederateState,std::default_delete<helics::FederateState>>>
              ((vector<std::unique_ptr<helics::FederateState,std::default_delete<helics::FederateState>>,std::allocator<std::unique_ptr<helics::FederateState,std::default_delete<helics::FederateState>>>>
                *)this,&local_40);
    std::unique_ptr<helics::FederateState,_std::default_delete<helics::FederateState>_>::~unique_ptr
              (&local_40);
    pVar2 = std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::__cxx11::string_const&,unsigned_long&>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)(this + 0x18),searchValue,&local_38);
    uVar1 = CONCAT71(pVar2._9_7_,1);
  }
  else {
    uVar1 = 0;
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar1;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_38._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(const searchType& searchValue, Us&&... data)
    {
        auto fnd = lookup.find(searchValue);
        if (fnd != lookup.end()) {
            return std::nullopt;
        }
        auto index = dataStorage.size();
        dataStorage.emplace_back(
            std::make_unique<VType>(std::forward<Us>(data)...));
        lookup.emplace(searchValue, index);
        return index;
    }